

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_js_api_json_autogen.cpp
# Opt level: O2

GetCommitmentRequestStruct * __thiscall
cfd::js::api::json::GetCommitmentRequest::ConvertToStruct
          (GetCommitmentRequestStruct *__return_storage_ptr__,GetCommitmentRequest *this)

{
  GetCommitmentRequestStruct::GetCommitmentRequestStruct(__return_storage_ptr__);
  __return_storage_ptr__->amount = this->amount_;
  std::__cxx11::string::_M_assign((string *)&__return_storage_ptr__->asset);
  std::__cxx11::string::_M_assign((string *)&__return_storage_ptr__->asset_blind_factor);
  std::__cxx11::string::_M_assign((string *)&__return_storage_ptr__->blind_factor);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&(__return_storage_ptr__->ignore_items)._M_t,&(this->ignore_items)._M_t);
  return __return_storage_ptr__;
}

Assistant:

GetCommitmentRequestStruct GetCommitmentRequest::ConvertToStruct() const {  // NOLINT
  GetCommitmentRequestStruct result;
  result.amount = amount_;
  result.asset = asset_;
  result.asset_blind_factor = asset_blind_factor_;
  result.blind_factor = blind_factor_;
  result.ignore_items = ignore_items;
  return result;
}